

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O2

Matrix * operator+(Matrix *__return_storage_ptr__,Matrix *lhs,Matrix *rhs)

{
  Fraction *pFVar1;
  Fraction *b;
  Fraction FVar2;
  invalid_argument *this;
  int i;
  int i_00;
  int j;
  int j_00;
  
  if (lhs->n_ == rhs->n_) {
    if (lhs->m_ == rhs->m_) {
      Matrix::Matrix(__return_storage_ptr__,lhs->n_,lhs->m_,0);
      for (i_00 = 0; i_00 < __return_storage_ptr__->n_; i_00 = i_00 + 1) {
        for (j_00 = 0; j_00 < __return_storage_ptr__->m_; j_00 = j_00 + 1) {
          pFVar1 = Matrix::At(lhs,i_00,j_00);
          b = Matrix::At(rhs,i_00,j_00);
          FVar2 = operator+(pFVar1,b);
          pFVar1 = Matrix::At(__return_storage_ptr__,i_00,j_00);
          *pFVar1 = FVar2;
        }
      }
      return __return_storage_ptr__;
    }
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this,"[SUM] Mismatched number of columns");
  }
  else {
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this,"[SUM] Mismatched number of rows");
  }
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

Matrix operator+(const Matrix& lhs, const Matrix& rhs) {
  if (lhs.GetNumRows() != rhs.GetNumRows()) {
    throw std::invalid_argument("[SUM] Mismatched number of rows");
  }

  if (lhs.GetNumColumns() != rhs.GetNumColumns()) {
    throw std::invalid_argument("[SUM] Mismatched number of columns");
  }

  Matrix result(lhs.GetNumRows(), lhs.GetNumColumns());
  for (int i = 0; i < result.GetNumRows(); ++i) {
    for (int j = 0; j < result.GetNumColumns(); ++j) {
      result.At(i, j) = lhs.At(i, j) + rhs.At(i, j);
    }
  }

  return result;
}